

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O0

void __thiscall
dg::DODRanganath::coloredDAG
          (DODRanganath *this,CDGraph *graph,CDNode *n,
          set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *visited)

{
  bool bVar1;
  reference ppCVar2;
  mapped_type *pmVar3;
  CDNode *in_RCX;
  CDGraph *in_RDX;
  DODRanganath *in_RSI;
  pair<std::_Rb_tree_const_iterator<dg::CDNode_*>,_bool> pVar4;
  CDNode *q_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  EdgesT *__range3_1;
  Color c;
  CDNode *s;
  CDNode *q;
  const_iterator __end3;
  const_iterator __begin3;
  EdgesT *__range3;
  EdgesT *successors;
  vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_> *in_stack_ffffffffffffff60;
  value_type *in_stack_ffffffffffffff68;
  __normal_iterator<dg::CDNode_*const_*,_std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>_>
  in_stack_ffffffffffffff70;
  Color local_7c;
  __normal_iterator<dg::CDNode_*const_*,_std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>_>
  local_78;
  CDNode *local_70;
  CDNode *local_68;
  CDNode **local_60;
  __normal_iterator<dg::CDNode_*const_*,_std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>_>
  local_58;
  EdgesT *local_50;
  EdgesT *local_48;
  _Base_ptr local_40;
  undefined1 local_38;
  _Base_ptr local_30;
  undefined1 uVar5;
  undefined7 in_stack_ffffffffffffffd9;
  
  pVar4 = std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::insert
                    ((set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *)
                     in_stack_ffffffffffffff70._M_current,in_stack_ffffffffffffff68);
  local_40 = (_Base_ptr)pVar4.first._M_node;
  local_38 = pVar4.second;
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_30 = local_40;
    uVar5 = local_38;
    local_48 = ElemWithEdges<dg::CDNode>::successors((ElemWithEdges<dg::CDNode> *)in_RDX);
    bVar1 = std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>::empty
                      (in_stack_ffffffffffffff60);
    if (!bVar1) {
      local_50 = local_48;
      local_58._M_current =
           (CDNode **)
           std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>::begin
                     (in_stack_ffffffffffffff48);
      local_60 = (CDNode **)
                 std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>::end
                           (in_stack_ffffffffffffff48);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<dg::CDNode_*const_*,_std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                (__normal_iterator<dg::CDNode_*const_*,_std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>_>
                                 *)in_stack_ffffffffffffff48), bVar1) {
        ppCVar2 = __gnu_cxx::
                  __normal_iterator<dg::CDNode_*const_*,_std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>_>
                  ::operator*(&local_58);
        local_68 = *ppCVar2;
        coloredDAG(in_RSI,in_RDX,in_RCX,
                   (set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *)
                   CONCAT71(in_stack_ffffffffffffffd9,uVar5));
        __gnu_cxx::
        __normal_iterator<dg::CDNode_*const_*,_std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>_>
        ::operator++(&local_58);
      }
      local_78._M_current =
           (CDNode **)
           std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>::begin
                     (in_stack_ffffffffffffff48);
      ppCVar2 = __gnu_cxx::
                __normal_iterator<dg::CDNode_*const_*,_std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>_>
                ::operator*(&local_78);
      local_70 = *ppCVar2;
      pmVar3 = std::
               unordered_map<dg::CDNode_*,_dg::DODRanganath::Info,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>_>
               ::operator[]((unordered_map<dg::CDNode_*,_dg::DODRanganath::Info,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            (key_type *)in_stack_ffffffffffffff48);
      local_7c = pmVar3->color;
      std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>::begin(in_stack_ffffffffffffff48);
      std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>::end(in_stack_ffffffffffffff48);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<dg::CDNode_*const_*,_std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                (__normal_iterator<dg::CDNode_*const_*,_std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>_>
                                 *)in_stack_ffffffffffffff48), bVar1) {
        __gnu_cxx::
        __normal_iterator<dg::CDNode_*const_*,_std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>_>
        ::operator*((__normal_iterator<dg::CDNode_*const_*,_std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>_>
                     *)&stack0xffffffffffffff70);
        pmVar3 = std::
                 unordered_map<dg::CDNode_*,_dg::DODRanganath::Info,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>_>
                 ::operator[]((unordered_map<dg::CDNode_*,_dg::DODRanganath::Info,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              (key_type *)in_stack_ffffffffffffff48);
        if (pmVar3->color != local_7c) {
          local_7c = UNCOLORED;
          break;
        }
        __gnu_cxx::
        __normal_iterator<dg::CDNode_*const_*,_std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>_>
        ::operator++((__normal_iterator<dg::CDNode_*const_*,_std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>_>
                      *)&stack0xffffffffffffff70);
      }
      pmVar3 = std::
               unordered_map<dg::CDNode_*,_dg::DODRanganath::Info,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>_>
               ::operator[]((unordered_map<dg::CDNode_*,_dg::DODRanganath::Info,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>_>
                             *)CONCAT44(local_7c,in_stack_ffffffffffffff50),
                            (key_type *)in_stack_ffffffffffffff48);
      pmVar3->color = local_7c;
    }
  }
  return;
}

Assistant:

void coloredDAG(CDGraph &graph, CDNode *n, std::set<CDNode *> &visited) {
        if (visited.insert(n).second) {
            const auto &successors = n->successors();
            if (successors.empty())
                return;

            for (auto *q : successors) {
                coloredDAG(graph, q, visited);
            }
            auto *s = *(successors.begin());
            auto c = data[s].color;
            for (auto *q : successors) {
                if (data[q].color != c) {
                    c = Color::UNCOLORED;
                    break;
                }
            }
            data[n].color = c;
        }
    }